

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::check_function_call_constraints
          (CompilerGLSL *this,uint32_t *args,uint32_t length)

{
  uint32_t id;
  CompilerError *this_00;
  allocator local_51;
  string local_50 [32];
  SPIRType *local_30;
  SPIRType *type;
  SPIRVariable *var;
  uint32_t i;
  uint32_t length_local;
  uint32_t *args_local;
  CompilerGLSL *this_local;
  
  var._0_4_ = 0;
  var._4_4_ = length;
  _i = args;
  args_local = (uint32_t *)this;
  do {
    if (var._4_4_ <= (uint)var) {
      return;
    }
    type = (SPIRType *)
           Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,_i[(uint)var]);
    if ((type != (SPIRType *)0x0) && (((type->member_types).buffer_capacity & 0x100000000) != 0)) {
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      local_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      if ((*(int *)&(local_30->super_IVariant).field_0xc == 0x10) &&
         ((local_30->image).dim == DimSubpassData)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_50,
                   "Tried passing a remapped subpassInput variable to a function. This will not work correctly because type-remapping information is lost. To workaround, please consider not passing the subpass input as a function parameter, or use in/out variables instead which do not need type remapping information."
                   ,&local_51);
        CompilerError::CompilerError(this_00,(string *)local_50);
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    var._0_4_ = (uint)var + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::check_function_call_constraints(const uint32_t *args, uint32_t length)
{
	// If our variable is remapped, and we rely on type-remapping information as
	// well, then we cannot pass the variable as a function parameter.
	// Fixing this is non-trivial without stamping out variants of the same function,
	// so for now warn about this and suggest workarounds instead.
	for (uint32_t i = 0; i < length; i++)
	{
		auto *var = maybe_get<SPIRVariable>(args[i]);
		if (!var || !var->remapped_variable)
			continue;

		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		{
			SPIRV_CROSS_THROW("Tried passing a remapped subpassInput variable to a function. "
			                  "This will not work correctly because type-remapping information is lost. "
			                  "To workaround, please consider not passing the subpass input as a function parameter, "
			                  "or use in/out variables instead which do not need type remapping information.");
		}
	}
}